

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

float tcu::sampleLinear2DCompare
                (ConstPixelBufferAccess *access,Sampler *sampler,float ref,float u,float v,
                IVec3 *offset,bool isFixedPointDepthFormat)

{
  bool bVar1;
  int iVar2;
  int size;
  deInt32 dVar3;
  int iVar4;
  deInt32 dVar5;
  int iVar6;
  int x;
  int x_00;
  TextureFormat *pTVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  byte local_c7;
  byte local_c6;
  byte local_c5;
  byte local_b9;
  float p11;
  float p01;
  float p10;
  float p00;
  Vec4 p11Clr;
  Vec4 p01Clr;
  Vec4 p10Clr;
  Vec4 p00Clr;
  bool j1UseBorder;
  bool j0UseBorder;
  bool i1UseBorder;
  bool i0UseBorder;
  float b;
  float a;
  int j1;
  int j0;
  int i1;
  int i0;
  int y1;
  int y0;
  int x1;
  int x0;
  int h;
  int w;
  bool isFixedPointDepthFormat_local;
  IVec3 *offset_local;
  float v_local;
  float u_local;
  float ref_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *access_local;
  
  iVar2 = ConstPixelBufferAccess::getWidth(access);
  size = ConstPixelBufferAccess::getHeight(access);
  dVar3 = deFloorFloatToInt32(u - 0.5);
  iVar4 = Vector<int,_3>::x(offset);
  dVar5 = deFloorFloatToInt32(v - 0.5);
  iVar6 = Vector<int,_3>::y(offset);
  x = wrap(sampler->wrapS,dVar3 + iVar4,iVar2);
  iVar4 = wrap(sampler->wrapS,dVar3 + iVar4 + 1,iVar2);
  x_00 = wrap(sampler->wrapT,dVar5 + iVar6,size);
  iVar6 = wrap(sampler->wrapT,dVar5 + iVar6 + 1,size);
  fVar8 = deFloatFrac(u - 0.5);
  fVar9 = deFloatFrac(v - 0.5);
  local_b9 = 0;
  if (sampler->wrapS == CLAMP_TO_BORDER) {
    bVar1 = de::inBounds<int>(x,0,iVar2);
    local_b9 = bVar1 ^ 0xff;
  }
  local_c5 = 0;
  if (sampler->wrapS == CLAMP_TO_BORDER) {
    bVar1 = de::inBounds<int>(iVar4,0,iVar2);
    local_c5 = bVar1 ^ 0xff;
  }
  local_c6 = 0;
  if (sampler->wrapT == CLAMP_TO_BORDER) {
    bVar1 = de::inBounds<int>(x_00,0,size);
    local_c6 = bVar1 ^ 0xff;
  }
  local_c7 = 0;
  if (sampler->wrapT == CLAMP_TO_BORDER) {
    bVar1 = de::inBounds<int>(iVar6,0,size);
    local_c7 = bVar1 ^ 0xff;
  }
  if (((local_b9 & 1) == 0) && ((local_c6 & 1) == 0)) {
    iVar2 = Vector<int,_3>::z(offset);
    lookup((tcu *)(p10Clr.m_data + 2),access,x,x_00,iVar2);
  }
  else {
    pTVar7 = ConstPixelBufferAccess::getFormat(access);
    lookupBorder((tcu *)(p10Clr.m_data + 2),pTVar7,sampler);
  }
  if (((local_c5 & 1) == 0) && ((local_c6 & 1) == 0)) {
    iVar2 = Vector<int,_3>::z(offset);
    lookup((tcu *)(p01Clr.m_data + 2),access,iVar4,x_00,iVar2);
  }
  else {
    pTVar7 = ConstPixelBufferAccess::getFormat(access);
    lookupBorder((tcu *)(p01Clr.m_data + 2),pTVar7,sampler);
  }
  if (((local_b9 & 1) == 0) && ((local_c7 & 1) == 0)) {
    iVar2 = Vector<int,_3>::z(offset);
    lookup((tcu *)(p11Clr.m_data + 2),access,x,iVar6,iVar2);
  }
  else {
    pTVar7 = ConstPixelBufferAccess::getFormat(access);
    lookupBorder((tcu *)(p11Clr.m_data + 2),pTVar7,sampler);
  }
  if (((local_c5 & 1) == 0) && ((local_c7 & 1) == 0)) {
    iVar2 = Vector<int,_3>::z(offset);
    lookup((tcu *)&p10,access,iVar4,iVar6,iVar2);
  }
  else {
    pTVar7 = ConstPixelBufferAccess::getFormat(access);
    lookupBorder((tcu *)&p10,pTVar7,sampler);
  }
  fVar10 = execCompare((Vec4 *)(p10Clr.m_data + 2),sampler->compare,sampler->compareChannel,ref,
                       isFixedPointDepthFormat);
  fVar11 = execCompare((Vec4 *)(p01Clr.m_data + 2),sampler->compare,sampler->compareChannel,ref,
                       isFixedPointDepthFormat);
  fVar12 = execCompare((Vec4 *)(p11Clr.m_data + 2),sampler->compare,sampler->compareChannel,ref,
                       isFixedPointDepthFormat);
  fVar13 = execCompare((Vec4 *)&p10,sampler->compare,sampler->compareChannel,ref,
                       isFixedPointDepthFormat);
  return fVar13 * fVar8 * fVar9 +
         fVar12 * (1.0 - fVar8) * fVar9 +
         fVar10 * (1.0 - fVar8) * (1.0 - fVar9) + fVar11 * fVar8 * (1.0 - fVar9);
}

Assistant:

static float sampleLinear2DCompare (const ConstPixelBufferAccess& access, const Sampler& sampler, float ref, float u, float v, const IVec3& offset, bool isFixedPointDepthFormat)
{
	int w = access.getWidth();
	int h = access.getHeight();

	int x0 = deFloorFloatToInt32(u-0.5f)+offset.x();
	int x1 = x0+1;
	int y0 = deFloorFloatToInt32(v-0.5f)+offset.y();
	int y1 = y0+1;

	int i0 = wrap(sampler.wrapS, x0, w);
	int i1 = wrap(sampler.wrapS, x1, w);
	int j0 = wrap(sampler.wrapT, y0, h);
	int j1 = wrap(sampler.wrapT, y1, h);

	float a = deFloatFrac(u-0.5f);
	float b = deFloatFrac(v-0.5f);

	bool i0UseBorder = sampler.wrapS == Sampler::CLAMP_TO_BORDER && !de::inBounds(i0, 0, w);
	bool i1UseBorder = sampler.wrapS == Sampler::CLAMP_TO_BORDER && !de::inBounds(i1, 0, w);
	bool j0UseBorder = sampler.wrapT == Sampler::CLAMP_TO_BORDER && !de::inBounds(j0, 0, h);
	bool j1UseBorder = sampler.wrapT == Sampler::CLAMP_TO_BORDER && !de::inBounds(j1, 0, h);

	// Border color for out-of-range coordinates if using CLAMP_TO_BORDER, otherwise execute lookups.
	Vec4 p00Clr = (i0UseBorder || j0UseBorder) ? lookupBorder(access.getFormat(), sampler) : lookup(access, i0, j0, offset.z());
	Vec4 p10Clr = (i1UseBorder || j0UseBorder) ? lookupBorder(access.getFormat(), sampler) : lookup(access, i1, j0, offset.z());
	Vec4 p01Clr = (i0UseBorder || j1UseBorder) ? lookupBorder(access.getFormat(), sampler) : lookup(access, i0, j1, offset.z());
	Vec4 p11Clr = (i1UseBorder || j1UseBorder) ? lookupBorder(access.getFormat(), sampler) : lookup(access, i1, j1, offset.z());

	// Execute comparisons.
	float p00 = execCompare(p00Clr, sampler.compare, sampler.compareChannel, ref, isFixedPointDepthFormat);
	float p10 = execCompare(p10Clr, sampler.compare, sampler.compareChannel, ref, isFixedPointDepthFormat);
	float p01 = execCompare(p01Clr, sampler.compare, sampler.compareChannel, ref, isFixedPointDepthFormat);
	float p11 = execCompare(p11Clr, sampler.compare, sampler.compareChannel, ref, isFixedPointDepthFormat);

	// Interpolate.
	return (p00*(1.0f-a)*(1.0f-b)) +
		   (p10*(     a)*(1.0f-b)) +
		   (p01*(1.0f-a)*(     b)) +
		   (p11*(     a)*(     b));
}